

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

void __thiscall SQFuncState::AddLineInfos(SQFuncState *this,SQInteger line,bool lineop,bool force)

{
  SQUnsignedInteger SVar1;
  ulong uVar2;
  SQInstruction in_RAX;
  long lVar3;
  SQLineInfo *p;
  ulong uVar4;
  SQUnsignedInteger SVar5;
  SQInstruction local_28;
  
  lVar3 = this->_lastline;
  if (lVar3 != line || force) {
    SVar1 = (this->_instructions)._size;
    local_28 = in_RAX;
    if (lineop) {
      local_28 = (SQInstruction)(line & 0xffffffff);
      AddInstruction(this,&local_28);
      lVar3 = this->_lastline;
    }
    if (lVar3 != line) {
      uVar2 = (this->_lineinfos)._allocated;
      p = (this->_lineinfos)._vals;
      uVar4 = (this->_lineinfos)._size;
      if (uVar2 <= uVar4) {
        SVar5 = 4;
        if (uVar4 * 2 != 0) {
          SVar5 = uVar4 * 2;
        }
        p = (SQLineInfo *)sq_vm_realloc(p,uVar2 << 4,SVar5 << 4);
        (this->_lineinfos)._vals = p;
        (this->_lineinfos)._allocated = SVar5;
        uVar4 = (this->_lineinfos)._size;
      }
      (this->_lineinfos)._size = uVar4 + 1;
      p[uVar4]._line = line;
      p[uVar4]._op = SVar1;
    }
    this->_lastline = line;
  }
  return;
}

Assistant:

void SQFuncState::AddLineInfos(SQInteger line,bool lineop,bool force)
{
    if(_lastline!=line || force){
        SQLineInfo li;
        li._line=line;li._op=(GetCurrentPos()+1);
        if(lineop)AddInstruction(_OP_LINE,0,line);
        if(_lastline!=line) {
            _lineinfos.push_back(li);
        }
        _lastline=line;
    }
}